

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

LIndex __thiscall
PlanningUnitMADPDiscrete::IndividualToJointActionObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIs)

{
  pointer puVar1;
  uint *puVar2;
  ulong __n;
  int iVar3;
  Index IVar4;
  undefined4 extraout_var;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pvVar9;
  pointer pvVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jobs;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  stageAction;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jacs;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> actionSeqs;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> observSeqs;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  stageObserv;
  allocator_type local_c5;
  Index local_c4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> local_78;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> local_60;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  size_type __n_00;
  
  __n = (ulong)t;
  iVar3 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])();
  __n_00 = CONCAT44(extraout_var,iVar3);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::vector
            (&local_60,__n_00,(allocator_type *)&local_78);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::vector
            (&local_78,__n_00,(allocator_type *)&local_48);
  local_c4 = t;
  if (__n_00 != 0) {
    uVar8 = 0;
    do {
      puVar5 = (uint *)operator_new__(__n * 4);
      local_60.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = puVar5;
      puVar5 = (uint *)operator_new__(__n * 4);
      local_78.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = puVar5;
      puVar1 = (indivIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(indivIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
      }
      GetActionObservationHistoryArrays
                (this,(Index)uVar8,puVar1[uVar8],local_c4,
                 local_78.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8],
                 local_60.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8]);
      uVar8 = (ulong)((Index)uVar8 + 1);
    } while (uVar8 < __n_00);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,__n_00,
             (allocator_type *)&local_c0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_48,__n,(value_type *)&local_a8,(allocator_type *)&local_90);
  if (local_a8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c0,__n_00,(allocator_type *)&local_90);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_a8,__n,&local_c0,&local_c5);
  if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (__n_00 != 0) {
    uVar8 = 0;
    do {
      if (local_c4 != 0) {
        puVar5 = local_60.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8];
        puVar2 = local_78.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8];
        uVar7 = 0;
        pvVar9 = local_a8.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar10 = local_48.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar8] = puVar5[uVar7];
          (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar8] = puVar2[uVar7];
          uVar7 = uVar7 + 1;
          pvVar10 = pvVar10 + 1;
          pvVar9 = pvVar9 + 1;
        } while (__n != uVar7);
      }
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) < __n_00);
    uVar6 = 1;
    uVar8 = 0;
    do {
      if (local_60.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] != (uint *)0x0) {
        operator_delete__(local_60.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar8]);
      }
      if (local_78.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] != (uint *)0x0) {
        operator_delete__(local_78.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar8]);
      }
      uVar8 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar8 < __n_00);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c0,__n,(allocator_type *)&local_90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_90,__n,(allocator_type *)&local_c5);
  if (local_c4 != 0) {
    uVar8 = 0;
    do {
      uVar6 = (**(code **)((long)*this->_m_madp + 0xe0))
                        (this->_m_madp,
                         local_48.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar8);
      local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = uVar6;
      uVar6 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[9])
                        (this,local_a8.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar8);
      local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = uVar6;
      uVar8 = uVar8 + 1;
    } while (uVar8 != __n);
  }
  IVar4 = GetJointActionObservationHistoryIndex(this,local_c4,&local_90,&local_c0);
  if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_48);
  if (local_78.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (ulong)IVar4;
}

Assistant:

LIndex 
PlanningUnitMADPDiscrete::IndividualToJointActionObservationHistoryIndex(
        Index t, const vector<Index>& indivIs) const
{
    //individual observation history index -> individual observation sequences
    size_t nrAg = GetNrAgents();
    vector< Index* > observSeqs(nrAg);
    vector< Index* > actionSeqs(nrAg);
    for (Index agentI = 0; agentI < nrAg; agentI++)
    {
        observSeqs[agentI] = new Index[t];
        actionSeqs[agentI] = new Index[t];
        Index aohI_thisAgent = indivIs.at(agentI);
        GetActionObservationHistoryArrays (agentI, aohI_thisAgent, t, 
                actionSeqs[agentI], observSeqs[agentI]  );
    }

    // observSeqs[agent][ts] -> stageObserv[ts][agent]
    vector< vector<Index> > stageObserv(t, vector<Index>(nrAg) );
    vector< vector<Index> > stageAction(t, vector<Index>(nrAg) );
    for (Index agentI = 0; agentI < nrAg; agentI++)
        for (Index ts = 0; ts < t; ts++)
        {
            stageObserv[ts][agentI] = observSeqs[agentI][ts];    
            stageAction[ts][agentI] = actionSeqs[agentI][ts];    
        }
    
    for (Index agentI = 0; agentI < nrAg; agentI++)
    {
        delete [] observSeqs[agentI];
        delete [] actionSeqs[agentI];
    }
    
    //individual observation sequences -> joint observation sequences.
    vector<Index> jobs(t);
    vector<Index> jacs(t);
    
    for (Index ts = 0; ts < t; ts++)
    {
        jobs[ts] = IndividualToJointObservationIndices(stageObserv[ts]);
        jacs[ts] = IndividualToJointActionIndices(stageAction[ts]);
        
    }

    //joint observation sequences -> joint history index.
    LIndex jaohI = GetJointActionObservationHistoryIndex(t, jacs, jobs);
    return(jaohI);
    
}